

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O3

void Assimp::IFC::QuadrifyPart
               (IfcVector2 *pmin,IfcVector2 *pmax,XYSortedField *field,
               vector<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
               *bbs,vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *out)

{
  _Rb_tree_header *p_Var1;
  double *pdVar2;
  pointer *ppaVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  _Base_ptr p_Var8;
  IfcVector2 *pIVar9;
  XYSortedField *field_00;
  _Base_ptr p_Var10;
  pointer ppVar11;
  iterator iVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  aiVector2t<double> local_88;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  uint local_54;
  IfcVector2 *local_50;
  XYSortedField *local_48;
  IfcVector2 local_40;
  
  local_78 = pmin->x;
  local_60 = pmax->x;
  if ((local_78 - local_60 == 0.0) && (!NAN(local_78 - local_60))) {
    return;
  }
  local_68 = pmin->y;
  local_70 = pmax->y;
  if ((local_68 - local_70 == 0.0) && (!NAN(local_68 - local_70))) {
    return;
  }
  p_Var10 = (field->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(field->_M_t)._M_impl.super__Rb_tree_header;
  local_50 = pmax;
  local_48 = field;
  if ((_Rb_tree_header *)p_Var10 != p_Var1) {
    ppVar11 = (bbs->
              super__Vector_base<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    do {
      pIVar9 = local_50;
      p_Var8 = p_Var10[1]._M_left;
      dVar4 = ppVar11[(long)p_Var8].first.x;
      if (local_60 <= dVar4) break;
      dVar5 = ppVar11[(long)p_Var8].second.x;
      if (((local_78 < dVar5) && (local_68 < ppVar11[(long)p_Var8].second.y)) &&
         (pdVar2 = &ppVar11[(long)p_Var8].first.y, *pdVar2 <= local_70 && local_70 != *pdVar2)) {
        local_70 = dVar4;
        if (dVar4 <= local_78) {
          local_70 = local_78;
        }
        dVar4 = local_70 - local_78;
        local_78 = dVar5;
        if ((dVar4 != 0.0) || (NAN(dVar4))) {
          iVar12._M_current =
               (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar12._M_current ==
              (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
            _M_realloc_insert<aiVector2t<double>const&>
                      ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)out,iVar12,
                       pmin);
            iVar12._M_current =
                 (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)
                 ._M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            dVar4 = pmin->y;
            (iVar12._M_current)->x = pmin->x;
            (iVar12._M_current)->y = dVar4;
            iVar12._M_current =
                 (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
            (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
            _M_impl.super__Vector_impl_data._M_finish = iVar12._M_current;
          }
          local_88.x = pmin->x;
          local_88.y = pIVar9->y;
          if (iVar12._M_current ==
              (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
            _M_realloc_insert<aiVector2t<double>>
                      ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)out,iVar12,
                       &local_88);
            iVar12._M_current =
                 (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)
                 ._M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            (iVar12._M_current)->x = local_88.x;
            (iVar12._M_current)->y = local_88.y;
            iVar12._M_current =
                 (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
            (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
            _M_impl.super__Vector_impl_data._M_finish = iVar12._M_current;
          }
          local_88.y = pIVar9->y;
          if (iVar12._M_current ==
              (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            local_88.x = local_70;
            std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
            _M_realloc_insert<aiVector2t<double>>
                      ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)out,iVar12,
                       &local_88);
            iVar12._M_current =
                 (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)
                 ._M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            (iVar12._M_current)->x = local_70;
            (iVar12._M_current)->y = local_88.y;
            iVar12._M_current =
                 (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
            (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
            _M_impl.super__Vector_impl_data._M_finish = iVar12._M_current;
          }
          local_88.y = pmin->y;
          local_88.x = local_70;
          if (iVar12._M_current ==
              (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
            _M_realloc_insert<aiVector2t<double>>
                      ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)out,iVar12,
                       &local_88);
          }
          else {
            (iVar12._M_current)->x = local_70;
            (iVar12._M_current)->y = local_88.y;
            ppaVar3 = &(out->
                       super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppaVar3 = *ppaVar3 + 1;
          }
          local_68 = pmin->y;
        }
        if (local_60 <= local_78) {
          local_78 = local_60;
        }
        if ((_Rb_tree_header *)p_Var10 == p_Var1) goto LAB_005c13d9;
        local_54 = 0;
        goto LAB_005c127f;
      }
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
    } while ((_Rb_tree_header *)p_Var10 != p_Var1);
  }
  iVar12._M_current =
       (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar12._M_current ==
      (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
    _M_realloc_insert<aiVector2t<double>const&>
              ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)out,iVar12,pmin);
    iVar12._M_current =
         (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl
         .super__Vector_impl_data._M_finish;
  }
  else {
    dVar4 = pmin->y;
    (iVar12._M_current)->x = pmin->x;
    (iVar12._M_current)->y = dVar4;
    iVar12._M_current =
         (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl
         .super__Vector_impl_data._M_finish + 1;
    (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar12._M_current;
  }
  pIVar9 = local_50;
  local_88.x = pmin->x;
  local_88.y = local_50->y;
  if (iVar12._M_current ==
      (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
    _M_realloc_insert<aiVector2t<double>>
              ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)out,iVar12,&local_88
              );
    iVar12._M_current =
         (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl
         .super__Vector_impl_data._M_finish;
  }
  else {
    (iVar12._M_current)->x = local_88.x;
    (iVar12._M_current)->y = local_88.y;
    iVar12._M_current =
         (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl
         .super__Vector_impl_data._M_finish + 1;
    (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar12._M_current;
  }
  if (iVar12._M_current ==
      (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
    _M_realloc_insert<aiVector2t<double>const&>
              ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)out,iVar12,pIVar9);
    iVar12._M_current =
         (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl
         .super__Vector_impl_data._M_finish;
  }
  else {
    dVar4 = pIVar9->y;
    (iVar12._M_current)->x = pIVar9->x;
    (iVar12._M_current)->y = dVar4;
    iVar12._M_current =
         (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl
         .super__Vector_impl_data._M_finish + 1;
    (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar12._M_current;
  }
  local_88.x = pIVar9->x;
  local_88.y = pmin->y;
  goto LAB_005c10e5;
  while( true ) {
    ppVar11 = ppVar11 + (long)p_Var10[1]._M_left;
    dVar4 = (ppVar11->first).y;
    dVar5 = pIVar9->y;
    if (dVar5 <= dVar4) break;
    dVar6 = (ppVar11->second).y;
    if (dVar6 <= local_68) {
      local_60 = local_68;
    }
    else {
      dVar7 = pmin->y;
      uVar13 = SUB84(dVar7,0);
      uVar14 = (undefined4)((ulong)dVar7 >> 0x20);
      if (dVar7 <= dVar4) {
        uVar13 = SUB84(dVar4,0);
        uVar14 = (undefined4)((ulong)dVar4 >> 0x20);
      }
      local_60 = dVar5;
      if (dVar6 <= dVar5) {
        local_60 = dVar6;
      }
      local_54 = (uint)CONCAT71((int7)((ulong)ppVar11 >> 8),1);
      if (local_68 <= (double)CONCAT44(uVar14,uVar13) && (double)CONCAT44(uVar14,uVar13) != local_68
         ) {
        local_88.y = local_68;
        local_40.y = (double)CONCAT44(uVar14,uVar13);
        local_88.x = local_70;
        local_40.x = local_78;
        QuadrifyPart(&local_88,&local_40,local_48,bbs,out);
      }
    }
    p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
    local_68 = local_60;
    if ((_Rb_tree_header *)p_Var10 == p_Var1) break;
LAB_005c127f:
    ppVar11 = (bbs->
              super__Vector_base<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (local_70 < ppVar11[(long)p_Var10[1]._M_left].first.x) break;
  }
  field_00 = local_48;
  if ((local_54 & 1) != 0) {
    if (local_68 < pIVar9->y) {
      local_88.x = local_70;
      local_88.y = local_68;
      local_40.x = local_78;
      local_40.y = pIVar9->y;
      QuadrifyPart(&local_88,&local_40,local_48,bbs,out);
    }
    dVar4 = pIVar9->x - local_78;
    if ((dVar4 == 0.0) && (!NAN(dVar4))) {
      return;
    }
    local_88.y = pmin->y;
    local_88.x = local_78;
    QuadrifyPart(&local_88,pIVar9,field_00,bbs,out);
    return;
  }
LAB_005c13d9:
  local_88.y = pmin->y;
  iVar12._M_current =
       (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar12._M_current ==
      (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_88.x = local_70;
    std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
    _M_realloc_insert<aiVector2t<double>>
              ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)out,iVar12,&local_88
              );
    iVar12._M_current =
         (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl
         .super__Vector_impl_data._M_finish;
  }
  else {
    (iVar12._M_current)->x = local_70;
    (iVar12._M_current)->y = local_88.y;
    iVar12._M_current =
         (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl
         .super__Vector_impl_data._M_finish + 1;
    (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar12._M_current;
  }
  local_88.y = pIVar9->y;
  if (iVar12._M_current ==
      (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_88.x = local_70;
    std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
    _M_realloc_insert<aiVector2t<double>>
              ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)out,iVar12,&local_88
              );
    iVar12._M_current =
         (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl
         .super__Vector_impl_data._M_finish;
  }
  else {
    (iVar12._M_current)->x = local_70;
    (iVar12._M_current)->y = local_88.y;
    iVar12._M_current =
         (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl
         .super__Vector_impl_data._M_finish + 1;
    (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar12._M_current;
  }
  local_88.y = pIVar9->y;
  if (iVar12._M_current ==
      (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_88.x = local_78;
    std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
    _M_realloc_insert<aiVector2t<double>>
              ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)out,iVar12,&local_88
              );
    iVar12._M_current =
         (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl
         .super__Vector_impl_data._M_finish;
  }
  else {
    (iVar12._M_current)->x = local_78;
    (iVar12._M_current)->y = local_88.y;
    iVar12._M_current =
         (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl
         .super__Vector_impl_data._M_finish + 1;
    (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar12._M_current;
  }
  local_88.y = pmin->y;
  local_88.x = local_78;
LAB_005c10e5:
  if (iVar12._M_current ==
      (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
    _M_realloc_insert<aiVector2t<double>>
              ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)out,iVar12,&local_88
              );
  }
  else {
    (iVar12._M_current)->x = local_88.x;
    (iVar12._M_current)->y = local_88.y;
    ppaVar3 = &(out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    *ppaVar3 = *ppaVar3 + 1;
  }
  return;
}

Assistant:

void QuadrifyPart(const IfcVector2& pmin, const IfcVector2& pmax, XYSortedField& field,
    const std::vector< BoundingBox >& bbs,
    std::vector<IfcVector2>& out)
{
    if (!(pmin.x-pmax.x) || !(pmin.y-pmax.y)) {
        return;
    }

    IfcFloat xs = 1e10, xe = 1e10;
    bool found = false;

    // Search along the x-axis until we find an opening
    XYSortedField::iterator start = field.begin();
    for(; start != field.end(); ++start) {
        const BoundingBox& bb = bbs[(*start).second];
        if(bb.first.x >= pmax.x) {
            break;
        }

        if (bb.second.x > pmin.x && bb.second.y > pmin.y && bb.first.y < pmax.y) {
            xs = bb.first.x;
            xe = bb.second.x;
            found = true;
            break;
        }
    }

    if (!found) {
        // the rectangle [pmin,pend] is opaque, fill it
        out.push_back(pmin);
        out.push_back(IfcVector2(pmin.x,pmax.y));
        out.push_back(pmax);
        out.push_back(IfcVector2(pmax.x,pmin.y));
        return;
    }

    xs = std::max(pmin.x,xs);
    xe = std::min(pmax.x,xe);

    // see if there's an offset to fill at the top of our quad
    if (xs - pmin.x) {
        out.push_back(pmin);
        out.push_back(IfcVector2(pmin.x,pmax.y));
        out.push_back(IfcVector2(xs,pmax.y));
        out.push_back(IfcVector2(xs,pmin.y));
    }

    // search along the y-axis for all openings that overlap xs and our quad
    IfcFloat ylast = pmin.y;
    found = false;
    for(; start != field.end(); ++start) {
        const BoundingBox& bb = bbs[(*start).second];
        if (bb.first.x > xs || bb.first.y >= pmax.y) {
            break;
        }

        if (bb.second.y > ylast) {

            found = true;
            const IfcFloat ys = std::max(bb.first.y,pmin.y), ye = std::min(bb.second.y,pmax.y);
            if (ys - ylast > 0.0f) {
                QuadrifyPart( IfcVector2(xs,ylast), IfcVector2(xe,ys) ,field,bbs,out);
            }

            // the following are the window vertices

            /*wnd.push_back(IfcVector2(xs,ys));
            wnd.push_back(IfcVector2(xs,ye));
            wnd.push_back(IfcVector2(xe,ye));
            wnd.push_back(IfcVector2(xe,ys));*/
            ylast = ye;
        }
    }
    if (!found) {
        // the rectangle [pmin,pend] is opaque, fill it
        out.push_back(IfcVector2(xs,pmin.y));
        out.push_back(IfcVector2(xs,pmax.y));
        out.push_back(IfcVector2(xe,pmax.y));
        out.push_back(IfcVector2(xe,pmin.y));
        return;
    }
    if (ylast < pmax.y) {
        QuadrifyPart( IfcVector2(xs,ylast), IfcVector2(xe,pmax.y) ,field,bbs,out);
    }

    // now for the whole rest
    if (pmax.x-xe) {
        QuadrifyPart(IfcVector2(xe,pmin.y), pmax ,field,bbs,out);
    }
}